

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void omp_get_place_proc_ids(int place_num,int *ids)

{
  kmp_affin_mask_t *pkVar1;
  long lVar2;
  long in_RSI;
  int in_EDI;
  kmp_affin_mask_t *mask;
  int j;
  int i;
  int local_18;
  int local_14;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  pkVar1 = __kmp_affinity_masks;
  if ((-1 < in_EDI) && (in_EDI < (int)__kmp_affinity_num_masks)) {
    lVar2 = (long)in_EDI * __kmp_affin_mask_size;
    local_18 = 0;
    for (local_14 = 0; (ulong)(long)local_14 < __kmp_affin_mask_size << 3; local_14 = local_14 + 1)
    {
      if ((((uint)__kmp_affin_fullMask[local_14 / 8] & 1 << ((byte)((long)local_14 % 8) & 0x1f)) !=
           0) && (((uint)pkVar1[local_14 / 8 + lVar2] & 1 << ((byte)((long)local_14 % 8) & 0x1f)) !=
                  0)) {
        *(int *)(in_RSI + (long)local_18 * 4) = local_14;
        local_18 = local_18 + 1;
      }
    }
  }
  return;
}

Assistant:

void FTN_STDCALL
FTN_GET_PLACE_PROC_IDS( int place_num, int *ids )
{
    #if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
    // Nothing.
    #else
        int i,j;
        if ( ! TCR_4(__kmp_init_middle) ) {
            __kmp_middle_initialize();
        }
        if ( place_num < 0 || place_num >= (int)__kmp_affinity_num_masks )
            return;
        kmp_affin_mask_t *mask = KMP_CPU_INDEX(__kmp_affinity_masks, place_num);
        j = 0;
        KMP_CPU_SET_ITERATE(i, mask) {
            if ((! KMP_CPU_ISSET(i, __kmp_affin_fullMask)) ||
              (!KMP_CPU_ISSET(i, mask))) {
                continue;
            }
            ids[j++] = i;
        }
    #endif
}